

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandBb2Wb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  uint fSeq;
  char *pcVar3;
  
  fSeq = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"svh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x73) goto LAB_001fc5e8;
    fSeq = fSeq ^ 1;
  }
  if (globalUtilOptind + 2 == argc) {
    Abc_NtkConvertBb2Wb(argv[globalUtilOptind],argv[(long)globalUtilOptind + 1],fSeq,fVerbose);
    return 0;
  }
  Abc_Print(-1,"Expecting two files names on the command line.\n");
LAB_001fc5e8:
  Abc_Print(-2,"usage: bb2wb [-svh] <file_in> <file_out>\n");
  Abc_Print(-2,"\t             replaces black boxes by white boxes with AND functions\n");
  Abc_Print(-2,"\t             (file names should have standard extensions, e.g. \"blif\")\n");
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fSeq == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-s         : toggle using sequential white boxes [default = %s]\n",pcVar2);
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v         : toggle verbose output [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h         : print the command usage\n");
  Abc_Print(-2,"\t<file_in>  : input file with design containing black boxes\n");
  Abc_Print(-2,"\t<file_out> : output file with design containing white boxes\n");
  return 1;
}

Assistant:

int Abc_CommandBb2Wb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkConvertBb2Wb( char * pFileNameIn, char * pFileNameOut, int fSeq, int fVerbose );
    int c;
    int fSeq;
    int fVerbose;
    // set defaults
    fSeq = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Expecting two files names on the command line.\n" );
        goto usage;
    }
    Abc_NtkConvertBb2Wb( argv[globalUtilOptind], argv[globalUtilOptind+1], fSeq, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: bb2wb [-svh] <file_in> <file_out>\n" );
    Abc_Print( -2, "\t             replaces black boxes by white boxes with AND functions\n" );
    Abc_Print( -2, "\t             (file names should have standard extensions, e.g. \"blif\")\n" );
    Abc_Print( -2, "\t-s         : toggle using sequential white boxes [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v         : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file_in>  : input file with design containing black boxes\n");
    Abc_Print( -2, "\t<file_out> : output file with design containing white boxes\n");
    return 1;
}